

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

void pbrt::ComputeBeamDiffusionBSSRDF(Float g,Float eta,BSSRDFTable *t)

{
  reference pvVar1;
  size_t sVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  _Any_data *func;
  long end;
  long start;
  int local_18;
  int local_14;
  _Any_data local_10;
  
  local_10._8_4_ = in_ZMM1._0_4_;
  local_10._M_unused._0_8_ = (undefined8)in_RDI;
  pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](in_RDI + 1,0);
  *pvVar1 = 0.0;
  pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                      (local_10._M_unused._M_function_pointer + 0x20),1);
  *pvVar1 = 0.0025;
  local_14 = 2;
  while( true ) {
    sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                       (local_10._M_unused._M_function_pointer + 0x20));
    if (sVar2 <= (ulong)(long)local_14) break;
    pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        (local_10._M_unused._M_function_pointer + 0x20),(long)(local_14 + -1));
    fVar3 = *pvVar1;
    pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        (local_10._M_unused._M_function_pointer + 0x20),(long)local_14);
    *pvVar1 = fVar3 * 1.2;
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    auVar4 = in_ZMM1._0_16_;
    sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                       local_10._M_unused._0_8_);
    if (sVar2 <= (ulong)(long)local_18) break;
    in_stack_ffffffffffffff7c = (float)(local_18 * -8);
    sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                       local_10._M_unused._0_8_);
    vcvtusi2ss_avx512f(auVar4,sVar2 - 1);
    in_stack_ffffffffffffff80 = FastExp(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff80 = 1.0 - in_stack_ffffffffffffff80;
    fVar3 = FastExp(in_stack_ffffffffffffff80);
    in_ZMM1 = ZEXT464((uint)(1.0 - fVar3));
    in_stack_ffffffffffffff84 = in_stack_ffffffffffffff80 / (1.0 - fVar3);
    pvVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                        local_10._M_unused._0_8_,(long)local_18);
    *pvVar1 = in_stack_ffffffffffffff84;
    local_18 = local_18 + 1;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_10._M_unused._0_8_);
  func = &local_10;
  end = (long)&local_10 + 0xc;
  start = (long)&local_10 + 8;
  std::function<void(long)>::
  function<pbrt::ComputeBeamDiffusionBSSRDF(float,float,pbrt::BSSRDFTable*)::__0,void>
            ((function<void_(long)> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (anon_class_24_3_b5c30896 *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  ParallelFor(start,end,(function<void_(long)> *)func);
  std::function<void_(long)>::~function((function<void_(long)> *)0x877e62);
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] =
            (1 - FastExp(-8 * i / (Float)(t->rhoSamples.size() - 1))) / (1 - FastExp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] = IntegrateCatmullRom(
            t->radiusSamples,
            pstd::span<const Float>(&t->profile[i * nSamples], nSamples),
            pstd::span<Float>(&t->profileCDF[i * nSamples], nSamples));
    });
}